

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O3

Id __thiscall
spv::Builder::makeCompositeConstant(Builder *this,Id typeId,Vector<Id> *members,bool specConstant)

{
  pointer *pppIVar1;
  Op typeClass;
  iterator __position;
  ulong uVar2;
  Id IVar3;
  Instruction *pIVar4;
  pointer puVar5;
  undefined7 in_register_00000009;
  pointer *__ptr;
  iterator __position_00;
  vector<spv::Instruction*,dxil_spv::ThreadLocalAllocator<spv::Instruction*>> *this_00;
  Op OVar6;
  long lVar7;
  Instruction *c;
  _Head_base<0UL,_spv::Instruction_*,_false> local_48;
  Instruction *local_40;
  ulong local_38;
  
  OVar6 = OpConstantComposite;
  if ((int)CONCAT71(in_register_00000009,specConstant) != 0) {
    OVar6 = OpSpecConstantComposite;
  }
  if (typeId == 0) {
    __assert_fail("typeId",
                  "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/glslang-spirv/SpvBuilder.cpp"
                  ,0x3ce,
                  "Id spv::Builder::makeCompositeConstant(Id, const dxil_spv::Vector<Id> &, bool)");
  }
  typeClass = (this->module).idToInstruction.
              super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
              ._M_impl.super__Vector_impl_data._M_start[typeId]->opCode;
  if (((0x1e < (ulong)typeClass) || ((0x51800000U >> (typeClass & OpTypeOpaque) & 1) == 0)) &&
     (typeClass != OpTypeCooperativeMatrixKHR)) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/glslang-spirv/SpvBuilder.cpp"
                  ,0x3d9,
                  "Id spv::Builder::makeCompositeConstant(Id, const dxil_spv::Vector<Id> &, bool)");
  }
  if ((!specConstant) && (IVar3 = findCompositeConstant(this,typeClass,members), IVar3 != 0)) {
    return IVar3;
  }
  local_38 = (ulong)typeClass;
  pIVar4 = (Instruction *)::dxil_spv::allocate_in_thread(0x38);
  IVar3 = this->uniqueId + 1;
  this->uniqueId = IVar3;
  pIVar4->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f31e0;
  pIVar4->resultId = IVar3;
  pIVar4->typeId = typeId;
  pIVar4->opCode = OVar6;
  (pIVar4->operands).super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pIVar4->operands).super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pIVar4->operands).super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pIVar4->block = (Block *)0x0;
  puVar5 = (members->super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_40 = pIVar4;
  if (0 < (int)((ulong)((long)(members->
                              super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)puVar5) >> 2)) {
    lVar7 = 0;
    do {
      local_48._M_head_impl._0_4_ = puVar5[lVar7];
      __position._M_current =
           (pIVar4->operands).
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (pIVar4->operands).
          super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                   &pIVar4->operands,__position,(uint *)&local_48);
        puVar5 = (members->
                 super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>).
                 _M_impl.super__Vector_impl_data._M_start;
      }
      else {
        *__position._M_current = puVar5[lVar7];
        (pIVar4->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < (int)((ulong)((long)(members->
                                         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                                         )._M_impl.super__Vector_impl_data._M_finish - (long)puVar5)
                          >> 2));
  }
  local_48._M_head_impl = pIVar4;
  std::
  vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
  ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
            ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
              *)&this->constantsTypesGlobals,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_48);
  uVar2 = local_38;
  if (local_48._M_head_impl != (Instruction *)0x0) {
    (*(local_48._M_head_impl)->_vptr_Instruction[1])();
  }
  if ((int)uVar2 == 0x1168) {
    __position_00._M_current =
         (this->coopmatConstants).
         super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position_00._M_current !=
        (this->coopmatConstants).
        super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      *__position_00._M_current = pIVar4;
      pppIVar1 = &(this->coopmatConstants).
                  super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppIVar1 = *pppIVar1 + 1;
      goto LAB_001b363c;
    }
    this_00 = (vector<spv::Instruction*,dxil_spv::ThreadLocalAllocator<spv::Instruction*>> *)
              &this->coopmatConstants;
  }
  else {
    this_00 = (vector<spv::Instruction*,dxil_spv::ThreadLocalAllocator<spv::Instruction*>> *)
              (this->groupedConstants + uVar2);
    __position_00._M_current =
         this->groupedConstants[uVar2].
         super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position_00._M_current !=
        this->groupedConstants[uVar2].
        super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      *__position_00._M_current = pIVar4;
      pppIVar1 = &this->groupedConstants[uVar2].
                  super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppIVar1 = *pppIVar1 + 1;
      goto LAB_001b363c;
    }
  }
  std::vector<spv::Instruction*,dxil_spv::ThreadLocalAllocator<spv::Instruction*>>::
  _M_realloc_insert<spv::Instruction*const&>(this_00,__position_00,&local_40);
LAB_001b363c:
  Module::mapInstruction(&this->module,local_40);
  return local_40->resultId;
}

Assistant:

Id Builder::makeCompositeConstant(Id typeId, const dxil_spv::Vector<Id>& members, bool specConstant)
{
    Op opcode = specConstant ? OpSpecConstantComposite : OpConstantComposite;
    assert(typeId);
    Op typeClass = getTypeClass(typeId);

    switch (typeClass) {
    case OpTypeVector:
    case OpTypeArray:
    case OpTypeStruct:
    case OpTypeMatrix:
    case OpTypeCooperativeMatrixKHR:
        break;
    default:
        assert(0);
        return makeFloatConstant(0.0);
    }

    if (! specConstant) {
        Id existing = findCompositeConstant(typeClass, members);
        if (existing)
            return existing;
    }

    Instruction* c = new Instruction(getUniqueId(), typeId, opcode);
    for (int op = 0; op < (int)members.size(); ++op)
        c->addIdOperand(members[op]);
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(c));

    if (typeClass == OpTypeCooperativeMatrixKHR)
        coopmatConstants.push_back(c);
    else
        groupedConstants[typeClass].push_back(c);

    module.mapInstruction(c);

    return c->getResultId();
}